

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteNull(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this)

{
  char *pcVar1;
  Stack<rapidjson::CrtAllocator> *this_00;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar2;
  char *pcVar3;
  
  this_00 = &this->os_->stack_;
  if (this_00->stackEnd_ < this_00->stackTop_ + 4) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,4);
  }
  pGVar2 = this->os_;
  pcVar3 = (pGVar2->stack_).stackTop_;
  pcVar1 = pcVar3 + 1;
  if (pcVar1 <= (pGVar2->stack_).stackEnd_) {
    (pGVar2->stack_).stackTop_ = pcVar1;
    *pcVar3 = 'n';
    pGVar2 = this->os_;
    pcVar3 = (pGVar2->stack_).stackTop_;
    pcVar1 = pcVar3 + 1;
    if (pcVar1 <= (pGVar2->stack_).stackEnd_) {
      (pGVar2->stack_).stackTop_ = pcVar1;
      *pcVar3 = 'u';
      pGVar2 = this->os_;
      pcVar3 = (pGVar2->stack_).stackTop_;
      pcVar1 = pcVar3 + 1;
      if (pcVar1 <= (pGVar2->stack_).stackEnd_) {
        (pGVar2->stack_).stackTop_ = pcVar1;
        *pcVar3 = 'l';
        pGVar2 = this->os_;
        pcVar3 = (pGVar2->stack_).stackTop_;
        pcVar1 = pcVar3 + 1;
        if (pcVar1 <= (pGVar2->stack_).stackEnd_) {
          (pGVar2->stack_).stackTop_ = pcVar1;
          *pcVar3 = 'l';
          return true;
        }
      }
    }
  }
  __assert_fail("stackTop_ + sizeof(T) * count <= stackEnd_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/stack.h"
                ,0x81,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

bool WriteNull()  {
        PutReserve(*os_, 4);
        PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 'l'); return true;
    }